

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O1

ByteData *
cfd::core::AdaptorUtil::Adapt
          (ByteData *__return_storage_ptr__,AdaptorSignature *adaptor_signature,Privkey *sk)

{
  _Alloc_hider adaptor_secret32;
  int iVar1;
  value_type_conflict *__val;
  secp256k1_context_struct *ctx;
  CfdException *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  secp256k1_ecdsa_signature secp_signature;
  string local_d8;
  ByteData local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  ByteData local_88;
  secp256k1_ecdsa_signature local_70;
  
  ctx = wally_get_secp_context();
  Privkey::GetData(&local_88,sk);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8,&local_88);
  adaptor_secret32._M_p = local_d8._M_dataplus._M_p;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)adaptor_signature);
  ByteData::GetBytes(&local_a0,&local_b8);
  iVar1 = secp256k1_ecdsa_adaptor_adapt
                    (ctx,&local_70,(uchar *)adaptor_secret32._M_p,
                     local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((uchar *)local_d8._M_dataplus._M_p != (uchar *)0x0) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (iVar1 == 1) {
    local_d8._M_dataplus._M_p = (pointer)0x0;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_allocated_capacity = 0;
    local_d8._M_dataplus._M_p = (pointer)operator_new(0x40);
    local_d8._M_string_length = (size_type)((uchar *)local_d8._M_dataplus._M_p + 0x40);
    ((uchar *)local_d8._M_dataplus._M_p)[0x30] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x31] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x32] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x33] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x34] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x35] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x36] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x37] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x38] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x39] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x3a] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x3b] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x3c] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x3d] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x3e] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x3f] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x20] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x21] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x22] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x23] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x24] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x25] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x26] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x27] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x28] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x29] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x2a] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x2b] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x2c] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x2d] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x2e] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x2f] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x10] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x11] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x12] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x13] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x14] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x15] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x16] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x17] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x18] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x19] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x1a] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x1b] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x1c] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x1d] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x1e] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0x1f] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[1] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[2] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[3] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[4] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[5] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[6] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[7] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[8] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[9] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[10] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0xb] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0xc] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0xd] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0xe] = '\0';
    ((uchar *)local_d8._M_dataplus._M_p)[0xf] = '\0';
    local_d8.field_2._M_allocated_capacity = local_d8._M_string_length;
    secp256k1_ecdsa_signature_serialize_compact(ctx,(uchar *)local_d8._M_dataplus._M_p,&local_70);
    ByteData::ByteData(__return_storage_ptr__,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8);
    if ((uchar *)local_d8._M_dataplus._M_p != (uchar *)0x0) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"Could not adapt signature.","");
  CfdException::CfdException(this,kCfdInternalError,&local_d8);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData AdaptorUtil::Adapt(
    const AdaptorSignature &adaptor_signature, const Privkey &sk) {
  auto ctx = wally_get_secp_context();
  secp256k1_ecdsa_signature secp_signature;
  auto ret = secp256k1_ecdsa_adaptor_adapt(
      ctx, &secp_signature, sk.GetData().GetBytes().data(),
      adaptor_signature.GetData().GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not adapt signature.");
  }

  std::vector<uint8_t> signature(64);
  secp256k1_ecdsa_signature_serialize_compact(
      ctx, signature.data(), &secp_signature);

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not serialize signature.");
  }

  return ByteData(signature);
}